

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_setup_connection(Curl_easy *data,connectdata *conn)

{
  curl_trc_feat *pcVar1;
  FILEPROTO *pFVar2;
  undefined8 uVar3;
  
  pFVar2 = (FILEPROTO *)(*Curl_ccalloc)(1,0x30);
  (data->req).p.file = pFVar2;
  uVar3 = 0x1b;
  if (pFVar2 != (FILEPROTO *)0x0) {
    uVar3 = 0;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"smtp_setup_connection() -> %d",uVar3);
  }
  return (CURLcode)uVar3;
}

Assistant:

static CURLcode smtp_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  CURLcode result;

  /* Initialise the SMTP layer */
  (void)conn;
  result = smtp_init(data);
  CURL_TRC_SMTP(data, "smtp_setup_connection() -> %d", result);
  return result;
}